

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

bool __thiscall Merlin::read_evidence(Merlin *this,string *evidence)

{
  byte bVar1;
  runtime_error *prVar2;
  void *this_00;
  mapped_type *pmVar3;
  runtime_error *e;
  size_t val;
  vindex var;
  int local_1d8;
  int i;
  int num_evid;
  string err_msg;
  istringstream local_1a0 [8];
  istringstream in;
  string *evidence_local;
  Merlin *this_local;
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)evidence,_S_in);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::
    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::clear(&this->m_evidence);
    std::istream::operator>>(local_1a0,&local_1d8);
    for (var._4_4_ = 0; var._4_4_ < local_1d8; var._4_4_ = var._4_4_ + 1) {
      this_00 = (void *)std::istream::operator>>(local_1a0,&val);
      std::istream::operator>>(this_00,(ulong *)&e);
      prVar2 = e;
      pmVar3 = std::
               map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[](&this->m_evidence,&val);
      *pmVar3 = (mapped_type)prVar2;
    }
    std::__cxx11::istringstream::~istringstream(local_1a0);
    return true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&num_evid,"Cannot open the evidence string",(allocator *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,(string *)&num_evid);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_evidence(std::string evidence) {
	try {

		// Open the evidence file
		std::istringstream in(evidence);
		if (in.fail()) {
			std::string err_msg("Cannot open the evidence string");
			throw std::runtime_error(err_msg);
		}

		// Clear any previous evidence
		m_evidence.clear();

		// Read the evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t val;
			in >> var >> val;
			m_evidence[var] = val;
		}

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}